

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O0

long d_string_replace_text_in_range(DString *d,size_t pos,size_t len,char *original,char *replace)

{
  char *pcVar1;
  size_t len_00;
  size_t sVar2;
  bool bVar3;
  char *local_68;
  char *match;
  size_t stop;
  long change;
  long len_r;
  long len_o;
  long delta;
  char *replace_local;
  char *original_local;
  size_t len_local;
  size_t pos_local;
  DString *d_local;
  
  if (((d == (DString *)0x0) || (original == (char *)0x0)) || (replace == (char *)0x0)) {
    d_local = (DString *)0x0;
  }
  else {
    len_o = 0;
    if (d->currentStringLength < pos) {
      d_local = (DString *)0x0;
    }
    else {
      len_00 = strlen(original);
      sVar2 = strlen(replace);
      if (len == 0xffffffffffffffff) {
        match = (char *)d->currentStringLength;
      }
      else {
        match = (char *)(pos + len);
        if ((char *)d->currentStringLength < match) {
          match = (char *)d->currentStringLength;
        }
      }
      local_68 = strstr(d->str + pos,original);
      while( true ) {
        bVar3 = false;
        if (local_68 != (char *)0x0) {
          bVar3 = local_68 + -(long)d->str < match;
        }
        if (!bVar3) break;
        pcVar1 = d->str;
        d_string_erase(d,(long)local_68 - (long)d->str,len_00);
        d_string_insert(d,(long)local_68 - (long)d->str,replace);
        len_o = (sVar2 - len_00) + len_o;
        match = match + (sVar2 - len_00);
        local_68 = strstr(local_68 + (long)(d->str + (sVar2 - (long)pcVar1)),original);
      }
      d_local = (DString *)len_o;
    }
  }
  return (long)d_local;
}

Assistant:

long d_string_replace_text_in_range(DString * d, size_t pos, size_t len, const char * original, const char * replace) {
	if (d && original && replace) {
		long delta = 0;		// Overall change in length

		if (pos > d->currentStringLength) {
			// Out of range
			return 0;
		}

		long len_o = strlen(original);
		long len_r = strlen(replace);
		long change = len_r - len_o;	// Change in length for each replacement

		size_t stop;

		if (len == -1) {
			stop = d->currentStringLength;
		} else {
			stop = pos + len;

			if (stop > d->currentStringLength) {
				stop = d->currentStringLength;
			}
		}

		char * match = strstr(&(d->str[pos]), original);

		while (match && (match - d->str < stop)) {
			pos = match - d->str;
			d_string_erase(d, match - d->str, len_o);
			d_string_insert(d, match - d->str, replace);

			delta += change;
			stop += change;
			match = strstr(d->str + pos + len_r, original);
		}

		return delta;
	} else {
		return 0;
	}
}